

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O0

void __thiscall CT::ContourTracing(CT *this,int x,int y,int i_label,bool b_external)

{
  long lVar1;
  bool bVar2;
  size_t *psVar3;
  Point_<int> *pt;
  long lVar4;
  bool local_91;
  undefined1 local_58 [16];
  bool local_48 [7];
  byte local_41;
  int i_previous_contour_point;
  int iStack_3c;
  bool b_isolated;
  Point2i crd_cur_point;
  Point2i crd_next_point;
  Point2i T;
  Point2i s;
  bool b_external_local;
  int i_label_local;
  int y_local;
  int x_local;
  CT *this_local;
  
  cv::Point_<int>::Point_(&T,x,y);
  cv::Point_<int>::Point_(&crd_next_point);
  cv::Point_<int>::Point_(&crd_cur_point);
  cv::Point_<int>::Point_((Point_<int> *)&i_previous_contour_point);
  lVar1 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10;
  psVar3 = cv::MatStep::operator[]
                     ((MatStep *)
                      &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48,0);
  *(char *)(lVar1 + (long)T.y * *psVar3 + (long)T.x) = (char)i_label;
  local_41 = 0;
  if (b_external) {
    local_48[0] = true;
    local_48[1] = false;
    local_48[2] = false;
    local_48[3] = false;
  }
  else {
    local_48[0] = true;
    local_48[1] = false;
    local_48[2] = false;
    local_48[3] = false;
  }
  Tracer((CT *)(local_58 + 8),(Point2i *)this,&T.x,local_48);
  pt = cv::Point_<int>::operator=(&crd_next_point,(Point_<int> *)(local_58 + 8));
  cv::Point_<int>::operator=(&crd_cur_point,pt);
  if ((local_41 & 1) == 0) {
    do {
      cv::Point_<int>::operator=((Point_<int> *)&i_previous_contour_point,&crd_cur_point);
      lVar1 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10;
      lVar4 = (long)iStack_3c;
      psVar3 = cv::MatStep::operator[]
                         ((MatStep *)
                          &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48,0);
      *(char *)(lVar1 + lVar4 * *psVar3 + (long)i_previous_contour_point) = (char)i_label;
      Tracer((CT *)local_58,(Point2i *)this,&i_previous_contour_point,local_48);
      cv::Point_<int>::operator=(&crd_cur_point,(Point_<int> *)local_58);
      bVar2 = cv::operator==((Point_<int> *)&i_previous_contour_point,&T);
      local_91 = false;
      if (bVar2) {
        local_91 = cv::operator==(&crd_cur_point,&crd_next_point);
      }
    } while (((local_91 ^ 0xffU) & 1) != 0);
  }
  return;
}

Assistant:

void ContourTracing(int x, int y, int i_label, bool b_external) {
        cv::Point2i s(x, y), T, crd_next_point, crd_cur_point;

        // The current point is labeled 
		img_.data[s.y * img_.step[0] + s.x] = i_label;

        bool b_isolated(false);
        int i_previous_contour_point;
        if (b_external)
            i_previous_contour_point = 6;
        else
            i_previous_contour_point = 7;

        // First call to Tracer
        crd_next_point = T = Tracer(s, i_previous_contour_point, b_isolated);
        if (b_isolated)
            return;

        do {
            crd_cur_point = crd_next_point;
            img_.data[crd_cur_point.y * img_.step[0] + crd_cur_point.x] = i_label;
            crd_next_point = Tracer(crd_cur_point, i_previous_contour_point, b_isolated);
        } while (!(crd_cur_point == s && crd_next_point == T));
    }